

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttdriver.c
# Opt level: O0

FT_Error tt_property_get(FT_Module module,char *property_name,void *value)

{
  undefined4 uVar1;
  int iVar2;
  FT_UInt *val;
  FT_UInt interpreter_version;
  TT_Driver driver;
  FT_Error error;
  void *value_local;
  char *property_name_local;
  FT_Module module_local;
  
  uVar1 = *(undefined4 *)&module[5].clazz;
  iVar2 = strcmp(property_name,"interpreter-version");
  if (iVar2 == 0) {
    *(undefined4 *)value = uVar1;
    module_local._4_4_ = 0;
  }
  else {
    module_local._4_4_ = 0xc;
  }
  return module_local._4_4_;
}

Assistant:

static FT_Error
  tt_property_get( FT_Module    module,         /* TT_Driver */
                   const char*  property_name,
                   const void*  value )
  {
    FT_Error   error  = FT_Err_Ok;
    TT_Driver  driver = (TT_Driver)module;

    FT_UInt  interpreter_version = driver->interpreter_version;


    if ( !ft_strcmp( property_name, "interpreter-version" ) )
    {
      FT_UInt*  val = (FT_UInt*)value;


      *val = interpreter_version;

      return error;
    }

    FT_TRACE0(( "tt_property_get: missing property `%s'\n",
                property_name ));
    return FT_THROW( Missing_Property );
  }